

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triangle.cpp
# Opt level: O0

Vector3d * __thiscall OpenMD::Triangle::computeNormal(Triangle *this)

{
  Vector3<double> *in_RSI;
  Vector3d *in_RDI;
  Vector3<double> *in_stack_00000020;
  Vector3<double> *in_stack_00000028;
  Vector3<double> *in_stack_ffffffffffffffb8;
  
  *(undefined1 *)((long)in_RSI[0xc].super_Vector<double,_3U>.data_ + 1) = 1;
  cross<double>(in_stack_00000028,in_stack_00000020);
  Vector3<double>::operator=(in_RSI,in_stack_ffffffffffffffb8);
  Vector3<double>::Vector3(in_RSI,in_stack_ffffffffffffffb8);
  return in_RDI;
}

Assistant:

Vector3d Triangle::computeNormal() {
  HaveNormal_ = true;
  normal_     = cross(a_, b_);
  return normal_;
}